

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psobjs.c
# Opt level: O0

FT_Error ps_parser_load_field
                   (PS_Parser parser,T1_Field field,void **objects,FT_UInt max_objects,
                   FT_ULong *pflags)

{
  FT_Byte FVar1;
  FT_Byte *pFVar2;
  FT_Byte *pFVar3;
  FT_Memory pFVar4;
  FT_Fixed *pFVar5;
  FT_UInt FVar6;
  int iVar7;
  FT_Int FVar8;
  uint uVar9;
  long *plVar10;
  FT_Pointer P;
  FT_Fixed FVar11;
  FT_BBox *bbox_1;
  FT_UInt i;
  FT_Int result_1;
  FT_Fixed *temp_1;
  FT_Memory memory_1;
  FT_Int result;
  FT_BBox *bbox;
  FT_Fixed temp [4];
  FT_String *string;
  FT_UInt len;
  FT_Memory memory;
  FT_Long val;
  FT_Byte *q;
  FT_Byte *old_limit;
  FT_Byte *old_cur;
  T1_TokenRec token2;
  T1_FieldType type;
  FT_Error error;
  FT_UInt idx;
  FT_UInt count;
  FT_Byte *limit;
  FT_Byte *cur;
  T1_TokenRec token;
  FT_ULong *pflags_local;
  FT_UInt max_objects_local;
  void **objects_local;
  T1_Field field_local;
  PS_Parser parser_local;
  
  token._16_8_ = pflags;
  ps_parser_to_token(parser,(T1_Token)&cur);
  if ((int)token.limit != 0) {
    error = 1;
    type = T1_FIELD_TYPE_NONE;
    limit = cur;
    _idx = token.start;
    token2.type = field->type;
    if (token2.type == (T1_TOKEN_TYPE_KEY|T1_TOKEN_TYPE_ARRAY)) {
      pFVar2 = parser->cursor;
      pFVar3 = parser->limit;
      parser->cursor = cur + 1;
      parser->limit = token.start + -1;
      ps_parser_to_token(parser,(T1_Token)&old_cur);
      parser->cursor = pFVar2;
      parser->limit = pFVar3;
      if ((int)token2.limit != 3) goto LAB_0030599f;
      token2.type = 8;
      FVar6 = error;
    }
    else {
      FVar6 = max_objects;
      if ((int)token.limit != 3) goto LAB_0030599f;
    }
    error = FVar6;
    if (max_objects != 0) {
      type = T1_FIELD_TYPE_BOOL;
      limit = limit + 1;
      _idx = token.start + -1;
LAB_0030599f:
      do {
        if (error == 0) {
          return 0;
        }
        plVar10 = (long *)((long)objects[type] + (ulong)field->offset);
        skip_spaces(&limit,_idx);
        switch(token2.type) {
        case T1_TOKEN_TYPE_ANY:
          iVar7 = ps_tobool(&limit,_idx);
          memory = (FT_Memory)(long)iVar7;
          break;
        case T1_TOKEN_TYPE_STRING:
          memory = (FT_Memory)PS_Conv_ToInt(&limit,_idx);
          break;
        case T1_TOKEN_TYPE_ARRAY:
          memory = (FT_Memory)PS_Conv_ToFixed(&limit,_idx,0);
          break;
        case T1_TOKEN_TYPE_KEY:
          memory = (FT_Memory)PS_Conv_ToFixed(&limit,_idx,3);
          break;
        case T1_TOKEN_TYPE_MAX:
        case T1_TOKEN_TYPE_KEY|T1_TOKEN_TYPE_STRING:
          pFVar4 = parser->memory;
          iVar7 = (int)_idx - (int)limit;
          temp[3] = 0;
          if (limit < _idx) {
            if ((int)token.limit == 4) {
              string._4_4_ = iVar7 - 1;
            }
            else {
              if ((int)token.limit != 2) {
                return 3;
              }
              string._4_4_ = iVar7 - 2;
            }
            limit = limit + 1;
            if (*plVar10 != 0) {
              ft_mem_free(pFVar4,(void *)*plVar10);
              *plVar10 = 0;
            }
            temp[3] = (FT_Fixed)
                      ft_mem_qalloc(pFVar4,(ulong)(string._4_4_ + 1),(FT_Error *)&token2.field_0x14)
            ;
            if (token2._20_4_ != 0) {
              return token2._20_4_;
            }
            memcpy((void *)temp[3],limit,(ulong)string._4_4_);
            *(undefined1 *)(temp[3] + (ulong)string._4_4_) = 0;
            *plVar10 = temp[3];
          }
          goto LAB_00305efd;
        case T1_TOKEN_TYPE_KEY|T1_TOKEN_TYPE_ARRAY:
          FVar8 = ps_tofixedarray(&limit,_idx,4,(FT_Fixed *)&bbox,0);
          if (FVar8 < 4) {
            return 3;
          }
          FVar11 = FT_RoundFix((FT_Fixed)bbox);
          *plVar10 = FVar11;
          FVar11 = FT_RoundFix(temp[0]);
          plVar10[1] = FVar11;
          FVar11 = FT_RoundFix(temp[1]);
          plVar10[2] = FVar11;
          FVar11 = FT_RoundFix(temp[2]);
          plVar10[3] = FVar11;
          goto LAB_00305efd;
        case 8:
          pFVar4 = parser->memory;
          P = ft_mem_qrealloc(pFVar4,8,0,(ulong)(max_objects << 2),(void *)0x0,
                              (FT_Error *)&token2.field_0x14);
          if (token2._20_4_ != 0) {
            return token2._20_4_;
          }
          for (bbox_1._0_4_ = 0; (uint)bbox_1 < 4; bbox_1._0_4_ = (uint)bbox_1 + 1) {
            uVar9 = ps_tofixedarray(&limit,_idx,max_objects,
                                    (FT_Fixed *)((long)P + (ulong)((uint)bbox_1 * max_objects) * 8),
                                    0);
            if (((int)uVar9 < 0) || (uVar9 < max_objects)) {
              token2._20_4_ = 3;
              ft_mem_free(pFVar4,P);
              return token2._20_4_;
            }
            skip_spaces(&limit,_idx);
          }
          for (bbox_1._0_4_ = 0; (uint)bbox_1 < max_objects; bbox_1._0_4_ = (uint)bbox_1 + 1) {
            pFVar5 = (FT_Fixed *)objects[(uint)bbox_1];
            FVar11 = FT_RoundFix(*(FT_Fixed *)((long)P + (ulong)(uint)bbox_1 * 8));
            *pFVar5 = FVar11;
            FVar11 = FT_RoundFix(*(FT_Fixed *)((long)P + (ulong)((uint)bbox_1 + max_objects) * 8));
            pFVar5[1] = FVar11;
            FVar11 = FT_RoundFix(*(FT_Fixed *)
                                  ((long)P + (ulong)((uint)bbox_1 + max_objects * 2) * 8));
            pFVar5[2] = FVar11;
            FVar11 = FT_RoundFix(*(FT_Fixed *)
                                  ((long)P + (ulong)((uint)bbox_1 + max_objects * 3) * 8));
            pFVar5[3] = FVar11;
          }
          ft_mem_free(pFVar4,P);
          goto LAB_00305efd;
        default:
          goto LAB_00305f25;
        }
        FVar1 = field->size;
        if (FVar1 == '\x01') {
          *(char *)plVar10 = (char)memory;
        }
        else if (FVar1 == '\x02') {
          *(short *)plVar10 = (short)memory;
        }
        else if (FVar1 == '\x04') {
          *(int *)plVar10 = (int)memory;
        }
        else {
          *plVar10 = (long)memory;
        }
LAB_00305efd:
        error = error + -1;
        type = type + T1_FIELD_TYPE_BOOL;
      } while( true );
    }
  }
LAB_00305f25:
  return 3;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  ps_parser_load_field( PS_Parser       parser,
                        const T1_Field  field,
                        void**          objects,
                        FT_UInt         max_objects,
                        FT_ULong*       pflags )
  {
    T1_TokenRec   token;
    FT_Byte*      cur;
    FT_Byte*      limit;
    FT_UInt       count;
    FT_UInt       idx;
    FT_Error      error;
    T1_FieldType  type;


    /* this also skips leading whitespace */
    ps_parser_to_token( parser, &token );
    if ( !token.type )
      goto Fail;

    count = 1;
    idx   = 0;
    cur   = token.start;
    limit = token.limit;

    type = field->type;

    /* we must detect arrays in /FontBBox */
    if ( type == T1_FIELD_TYPE_BBOX )
    {
      T1_TokenRec  token2;
      FT_Byte*     old_cur   = parser->cursor;
      FT_Byte*     old_limit = parser->limit;


      /* don't include delimiters */
      parser->cursor = token.start + 1;
      parser->limit  = token.limit - 1;

      ps_parser_to_token( parser, &token2 );
      parser->cursor = old_cur;
      parser->limit  = old_limit;

      if ( token2.type == T1_TOKEN_TYPE_ARRAY )
      {
        type = T1_FIELD_TYPE_MM_BBOX;
        goto FieldArray;
      }
    }
    else if ( token.type == T1_TOKEN_TYPE_ARRAY )
    {
      count = max_objects;

    FieldArray:
      /* if this is an array and we have no blend, an error occurs */
      if ( max_objects == 0 )
        goto Fail;

      idx = 1;

      /* don't include delimiters */
      cur++;
      limit--;
    }

    for ( ; count > 0; count--, idx++ )
    {
      FT_Byte*    q      = (FT_Byte*)objects[idx] + field->offset;
      FT_Long     val;


      skip_spaces( &cur, limit );

      switch ( type )
      {
      case T1_FIELD_TYPE_BOOL:
        val = ps_tobool( &cur, limit );
        FT_TRACE4(( " %s", val ? "true" : "false" ));
        goto Store_Integer;

      case T1_FIELD_TYPE_FIXED:
        val = PS_Conv_ToFixed( &cur, limit, 0 );
        FT_TRACE4(( " %f", (double)val / 65536 ));
        goto Store_Integer;

      case T1_FIELD_TYPE_FIXED_1000:
        val = PS_Conv_ToFixed( &cur, limit, 3 );
        FT_TRACE4(( " %f", (double)val / 65536 / 1000 ));
        goto Store_Integer;

      case T1_FIELD_TYPE_INTEGER:
        val = PS_Conv_ToInt( &cur, limit );
        FT_TRACE4(( " %ld", val ));
        /* fall through */

      Store_Integer:
        switch ( field->size )
        {
        case (8 / FT_CHAR_BIT):
          *(FT_Byte*)q = (FT_Byte)val;
          break;

        case (16 / FT_CHAR_BIT):
          *(FT_UShort*)q = (FT_UShort)val;
          break;

        case (32 / FT_CHAR_BIT):
          *(FT_UInt32*)q = (FT_UInt32)val;
          break;

        default:                /* for 64-bit systems */
          *(FT_Long*)q = val;
        }
        break;

      case T1_FIELD_TYPE_STRING:
      case T1_FIELD_TYPE_KEY:
        {
          FT_Memory   memory = parser->memory;
          FT_UInt     len    = (FT_UInt)( limit - cur );
          FT_String*  string = NULL;


          if ( cur >= limit )
            break;

          /* we allow both a string or a name   */
          /* for cases like /FontName (foo) def */
          if ( token.type == T1_TOKEN_TYPE_KEY )
          {
            /* don't include leading `/' */
            len--;
            cur++;
          }
          else if ( token.type == T1_TOKEN_TYPE_STRING )
          {
            /* don't include delimiting parentheses    */
            /* XXX we don't handle <<...>> here        */
            /* XXX should we convert octal escapes?    */
            /*     if so, what encoding should we use? */
            cur++;
            len -= 2;
          }
          else
          {
            FT_ERROR(( "ps_parser_load_field:"
                       " expected a name or string\n" ));
            FT_ERROR(( "                     "
                       " but found token of type %d instead\n",
                       token.type ));
            error = FT_THROW( Invalid_File_Format );
            goto Exit;
          }

          /* for this to work (FT_String**)q must have been */
          /* initialized to NULL                            */
          if ( *(FT_String**)q )
          {
            FT_TRACE0(( "ps_parser_load_field: overwriting field %s\n",
                        field->ident ));
            FT_FREE( *(FT_String**)q );
          }

          if ( FT_QALLOC( string, len + 1 ) )
            goto Exit;

          FT_MEM_COPY( string, cur, len );
          string[len] = 0;

#ifdef FT_DEBUG_LEVEL_TRACE
          if ( token.type == T1_TOKEN_TYPE_STRING )
            FT_TRACE4(( " (%s)", string ));
          else
            FT_TRACE4(( " /%s", string ));
#endif

          *(FT_String**)q = string;
        }
        break;

      case T1_FIELD_TYPE_BBOX:
        {
          FT_Fixed  temp[4];
          FT_BBox*  bbox = (FT_BBox*)q;
          FT_Int    result;


          result = ps_tofixedarray( &cur, limit, 4, temp, 0 );

          if ( result < 4 )
          {
            FT_ERROR(( "ps_parser_load_field:"
                       " expected four integers in bounding box\n" ));
            error = FT_THROW( Invalid_File_Format );
            goto Exit;
          }

          bbox->xMin = FT_RoundFix( temp[0] );
          bbox->yMin = FT_RoundFix( temp[1] );
          bbox->xMax = FT_RoundFix( temp[2] );
          bbox->yMax = FT_RoundFix( temp[3] );

          FT_TRACE4(( " [%ld %ld %ld %ld]",
                      bbox->xMin / 65536,
                      bbox->yMin / 65536,
                      bbox->xMax / 65536,
                      bbox->yMax / 65536 ));
        }
        break;

      case T1_FIELD_TYPE_MM_BBOX:
        {
          FT_Memory  memory = parser->memory;
          FT_Fixed*  temp   = NULL;
          FT_Int     result;
          FT_UInt    i;


          if ( FT_QNEW_ARRAY( temp, max_objects * 4 ) )
            goto Exit;

          for ( i = 0; i < 4; i++ )
          {
            result = ps_tofixedarray( &cur, limit, (FT_Int)max_objects,
                                      temp + i * max_objects, 0 );
            if ( result < 0 || (FT_UInt)result < max_objects )
            {
              FT_ERROR(( "ps_parser_load_field:"
                         " expected %d integer%s in the %s subarray\n",
                         max_objects, max_objects > 1 ? "s" : "",
                         i == 0 ? "first"
                                : ( i == 1 ? "second"
                                           : ( i == 2 ? "third"
                                                      : "fourth" ) ) ));
              FT_ERROR(( "                     "
                         " of /FontBBox in the /Blend dictionary\n" ));
              error = FT_THROW( Invalid_File_Format );

              FT_FREE( temp );
              goto Exit;
            }

            skip_spaces( &cur, limit );
          }

          FT_TRACE4(( " [" ));
          for ( i = 0; i < max_objects; i++ )
          {
            FT_BBox*  bbox = (FT_BBox*)objects[i];


            bbox->xMin = FT_RoundFix( temp[i                  ] );
            bbox->yMin = FT_RoundFix( temp[i +     max_objects] );
            bbox->xMax = FT_RoundFix( temp[i + 2 * max_objects] );
            bbox->yMax = FT_RoundFix( temp[i + 3 * max_objects] );

            FT_TRACE4(( " [%ld %ld %ld %ld]",
                        bbox->xMin / 65536,
                        bbox->yMin / 65536,
                        bbox->xMax / 65536,
                        bbox->yMax / 65536 ));
          }
          FT_TRACE4(( "]" ));

          FT_FREE( temp );
        }
        break;

      default:
        /* an error occurred */
        goto Fail;
      }
    }

#if 0  /* obsolete -- keep for reference */
    if ( pflags )
      *pflags |= 1L << field->flag_bit;
#else
    FT_UNUSED( pflags );
#endif

    error = FT_Err_Ok;

  Exit:
    return error;

  Fail:
    error = FT_THROW( Invalid_File_Format );
    goto Exit;
  }